

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void getPart(char *attrName,int argc,char **argv,int *i,int *part)

{
  char *__s1;
  int iVar1;
  long lVar2;
  invalid_argument *this;
  
  if (*i <= argc + -2) {
    __s1 = argv[(long)*i + 1];
    iVar1 = strcmp(__s1,"any");
    if (iVar1 == 0) {
      iVar1 = -1;
    }
    else {
      lVar2 = strtol(__s1,(char **)0x0,0);
      iVar1 = (int)lVar2;
    }
    *part = iVar1;
    *i = *i + 2;
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Expected a part number (or \"any\")");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
getPart (const char attrName[], int argc, char** argv, int& i, int& part)
{
    if (i > argc - 2)
        throw invalid_argument("Expected a part number (or \"any\")");

    if (!strcmp (argv[i + 1], "any"))
        part = -1;
    else
        part = strtol (argv[i + 1], 0, 0);

    i += 2;
}